

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseVar(WastParser *this,Var *out_var)

{
  Location loc;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Result result;
  Literal *pLVar2;
  const_iterator s;
  const_iterator end;
  size_type sVar3;
  const_pointer pcVar4;
  undefined8 in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_210;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1eb;
  allocator local_1ea;
  allocator local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string asStack_1c8 [32];
  iterator local_1a8;
  size_type local_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  string_view local_180;
  Var local_170;
  undefined1 local_128 [8];
  Token token_1;
  uint64_t local_78;
  uint64_t index;
  string_view sv;
  Token token;
  Var *out_var_local;
  WastParser *this_local;
  
  bVar1 = PeekMatch(this,Last_Literal);
  if (bVar1) {
    Consume((Token *)&sv.size_,this);
    pLVar2 = Token::literal((Token *)&sv.size_);
    index = (uint64_t)(pLVar2->text).data_;
    sv.data_ = (char *)(pLVar2->text).size_;
    local_78 = 0xffffffff;
    s = string_view::begin((string_view *)&index);
    end = string_view::end((string_view *)&index);
    result = ParseUint64(s,end,&local_78);
    bVar1 = Failed(result);
    if (bVar1) {
      sVar3 = string_view::length((string_view *)&index);
      pcVar4 = string_view::data((string_view *)&index);
      loc.filename.size_ = (size_type)token.loc.filename.data_;
      loc.filename.data_ = (char *)sv.size_;
      loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           token.loc.filename.size_;
      loc.field_1._8_8_ = token.loc.field_1.field_1.offset;
      Error(this,loc,"invalid int \"%.*s\"",sVar3 & 0xffffffff,pcVar4,token.loc.filename.size_,in_R9
           );
    }
    Var::Var((Var *)&token_1.field_2.literal_.text.size_,(Index)local_78,(Location *)&sv.size_);
    Var::operator=(out_var,(Var *)&token_1.field_2.literal_.text.size_);
    Var::~Var((Var *)&token_1.field_2.literal_.text.size_);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    bVar1 = PeekMatch(this,Last_String);
    if (bVar1) {
      Consume((Token *)local_128,this);
      local_180 = Token::text((Token *)local_128);
      Var::Var(&local_170,local_180,(Location *)local_128);
      Var::operator=(out_var,&local_170);
      Var::~Var(&local_170);
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1e8,"a numeric index",&local_1e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(asStack_1c8,"a name",&local_1ea);
      local_1a8 = &local_1e8;
      local_1a0 = 2;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_1eb);
      __l._M_len = local_1a0;
      __l._M_array = local_1a8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_198,__l,&local_1eb);
      this_local._4_4_ = ErrorExpected(this,&local_198,"12 or $foo");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_198);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_1eb);
      local_210 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8;
      do {
        local_210 = local_210 + -1;
        std::__cxx11::string::~string((string *)local_210);
      } while (local_210 != &local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1ea);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseVar(Var* out_var) {
  WABT_TRACE(ParseVar);
  if (PeekMatch(TokenType::Nat)) {
    Token token = Consume();
    string_view sv = token.literal().text;
    uint64_t index = kInvalidIndex;
    if (Failed(ParseUint64(sv.begin(), sv.end(), &index))) {
      // Print an error, but don't fail parsing.
      Error(token.loc, "invalid int \"" PRIstringview "\"",
            WABT_PRINTF_STRING_VIEW_ARG(sv));
    }

    *out_var = Var(index, token.loc);
    return Result::Ok;
  } else if (PeekMatch(TokenType::Var)) {
    Token token = Consume();
    *out_var = Var(token.text(), token.loc);
    return Result::Ok;
  } else {
    return ErrorExpected({"a numeric index", "a name"}, "12 or $foo");
  }
}